

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void SequenceTaskCostToGo::run(search *sch,multi_ex *ec)

{
  size_t nmemb;
  pointer ppeVar1;
  uint32_t uVar2;
  action a;
  float *costs;
  predictor *ppVar3;
  stringstream *psVar4;
  ostream *poVar5;
  size_t k;
  size_t sVar6;
  ulong uVar7;
  string local_138;
  predictor P;
  
  nmemb = *sch->task_data;
  costs = calloc_or_throw<float>(nmemb);
  Search::predictor::predictor(&P,sch,0);
  for (uVar7 = 0;
      ppeVar1 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppeVar1 >> 3);
      uVar7 = uVar7 + 1) {
    uVar2 = (ppeVar1[uVar7]->l).multi.label;
    for (sVar6 = 0; nmemb != sVar6; sVar6 = sVar6 + 1) {
      costs[sVar6] = 1.0;
    }
    costs[uVar2 - 1] = 0.0;
    ppVar3 = Search::predictor::set_tag(&P,(ptag)uVar7 + 1);
    ppVar3 = Search::predictor::set_input
                       (ppVar3,(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar7]);
    ppVar3 = Search::predictor::set_allowed(ppVar3,(action *)0x0,costs,nmemb);
    uVar2 = Search::search::get_history_length(sch);
    ppVar3 = Search::predictor::set_condition_range(ppVar3,(ptag)uVar7,uVar2,'p');
    a = Search::predictor::predict(ppVar3);
    psVar4 = Search::search::output_abi_cxx11_(sch);
    if (*(int *)(psVar4 + *(long *)(*(long *)psVar4 + -0x18) + 0x20) == 0) {
      psVar4 = Search::search::output_abi_cxx11_(sch);
      Search::search::pretty_label_abi_cxx11_(&local_138,sch,a);
      poVar5 = std::operator<<((ostream *)(psVar4 + 0x10),(string *)&local_138);
      std::operator<<(poVar5,' ');
      std::__cxx11::string::~string((string *)&local_138);
    }
  }
  free(costs);
  Search::predictor::~predictor(&P);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  size_t K = *sch.get_task_data<size_t>();
  float* costs = calloc_or_throw<float>(K);
  Search::predictor P(sch, (ptag)0);
  for (size_t i = 0; i < ec.size(); i++)
  {
    action oracle = ec[i]->l.multi.label;
    for (size_t k = 0; k < K; k++) costs[k] = 1.;
    costs[oracle - 1] = 0.;
    size_t prediction = P.set_tag((ptag)i + 1)
                            .set_input(*ec[i])
                            .set_allowed(nullptr, costs, K)
                            .set_condition_range((ptag)i, sch.get_history_length(), 'p')
                            .predict();
    if (sch.output().good())
      sch.output() << sch.pretty_label((uint32_t)prediction) << ' ';
  }
  free(costs);
}